

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O2

void __thiscall
WDL_Resampler::WDL_Resampler_Filter::ApplyIIRFade
          (WDL_Resampler_Filter *this,WDL_ResampleSample *out1,int ns,int span,double *hsave,
          double v0,double dv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar1 = this->m_b0;
  dVar2 = this->m_b1;
  dVar3 = this->m_b2;
  dVar4 = this->m_a1;
  dVar5 = this->m_a2;
  uVar9 = SUB84(hsave[1],0);
  uVar10 = (undefined4)((ulong)hsave[1] >> 0x20);
  dVar13 = hsave[2];
  dVar8 = *hsave;
  dVar11 = hsave[3];
  while (dVar7 = dVar13, bVar6 = ns != 0, ns = ns + -1, bVar6) {
    dVar12 = (double)*out1;
    dVar11 = (((double)CONCAT44(uVar10,uVar9) * dVar3 + dVar12 * dVar1 + dVar2 * dVar8) -
             dVar7 * dVar4) - dVar11 * dVar5;
    dVar13 = 0.0;
    if (((ulong)dVar11 & 0x7ff0000000000000) != 0) {
      dVar13 = dVar11;
    }
    *out1 = (float)(dVar13 * v0 + (1.0 - v0) * dVar12);
    v0 = v0 + dv;
    out1 = out1 + span;
    uVar9 = SUB84(dVar8,0);
    uVar10 = (undefined4)((ulong)dVar8 >> 0x20);
    dVar8 = dVar12;
    dVar11 = dVar7;
  }
  *hsave = dVar8;
  hsave[1] = (double)CONCAT44(uVar10,uVar9);
  hsave[2] = dVar7;
  hsave[3] = dVar11;
  return;
}

Assistant:

void ApplyIIRFade(WDL_ResampleSample *out1, int ns, int span, double *hsave, double v0, double dv)
  {
    double b0=m_b0,b1=m_b1,b2=m_b2,a1=m_a1,a2=m_a2;
    double hist[4];
    memcpy(hist,hsave, sizeof(hist));
    while (ns--)
    {
      double in=*out1;
      double out = (double) ( in*b0 + hist[0]*b1 + hist[1]*b2 - hist[2]*a1 - hist[3]*a2);
      hist[1]=hist[0]; hist[0]=in;
      hist[3]=hist[2];
      *out1 = (hist[2] = denormal_filter_double(out)) * v0 + in * (1.0-v0);
      v0 += dv;
      out1+=span;
    }
    memcpy(hsave, hist, sizeof(hist));
  }